

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O3

void absl::log_internal::SetTimeZone(undefined8 param_1)

{
  undefined8 *puVar1;
  bool bVar2;
  
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = param_1;
  LOCK();
  bVar2 = (anonymous_namespace)::timezone_ptr != (undefined8 *)0x0;
  if (bVar2) {
    puVar1 = (anonymous_namespace)::timezone_ptr;
  }
  (anonymous_namespace)::timezone_ptr = puVar1;
  UNLOCK();
  if (bVar2) {
    raw_log_internal::RawLog
              (kFatal,"globals.cc",0x69,"absl::log_internal::SetTimeZone() has already been called")
    ;
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/log/internal/globals.cc"
                  ,0x69,"void absl::log_internal::SetTimeZone(absl::TimeZone)");
  }
  return;
}

Assistant:

void SetTimeZone(absl::TimeZone tz) {
  absl::TimeZone* expected = nullptr;
  absl::TimeZone* new_tz = new absl::TimeZone(tz);
  // timezone_ptr can only be set once, otherwise new_tz is leaked.
  if (!timezone_ptr.compare_exchange_strong(expected, new_tz,
                                            std::memory_order_release,
                                            std::memory_order_relaxed)) {
    ABSL_RAW_LOG(FATAL,
                 "absl::log_internal::SetTimeZone() has already been called");
  }
}